

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_ssm_conv(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  int iVar11;
  int i0;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  undefined8 uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int i2;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  float sumf;
  undefined1 auVar25 [16];
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x1d4b,"fatal error");
  }
  iVar19 = (int)pgVar3->ne[1];
  if (dst->ne[0] == (long)iVar19) {
    if (pgVar3->nb[0] == 4) {
      pgVar4 = dst->src[1];
      if (pgVar4->nb[0] == 4) {
        lVar5 = pgVar3->ne[0];
        sVar6 = pgVar3->nb[1];
        if (sVar6 == lVar5 * 4) {
          uVar1 = (uint)dst->ne[1];
          uVar2 = (uint)dst->ne[2];
          iVar11 = (params->nth + -1 + iVar19) / params->nth;
          uVar20 = (uint)pgVar4->ne[0];
          iVar12 = params->ith * iVar11;
          iVar11 = iVar11 + iVar12;
          lVar15 = (long)iVar12;
          if (iVar19 <= iVar11) {
            iVar11 = iVar19;
          }
          for (uVar24 = 0; uVar24 != (~((int)uVar2 >> 0x1f) & uVar2); uVar24 = uVar24 + 1) {
            lVar21 = sVar6 * lVar15;
            for (uVar22 = 0; uVar22 != (~((int)uVar1 >> 0x1f) & uVar1); uVar22 = uVar22 + 1) {
              sVar7 = dst->nb[0];
              sVar8 = dst->nb[1];
              sVar9 = dst->nb[2];
              pvVar10 = dst->data;
              pvVar17 = (void *)(pgVar4->nb[1] * lVar15 + (long)pgVar4->data);
              lVar23 = pgVar3->nb[2] * uVar24 + lVar21 + (long)pgVar3->data;
              for (uVar16 = 0; uVar16 != (uint)(~(iVar11 - iVar12 >> 0x1f) & iVar11 - iVar12);
                  uVar16 = uVar16 + 1) {
                auVar25 = ZEXT816(0) << 0x40;
                for (uVar13 = 0; (~((int)uVar20 >> 0x1f) & uVar20) != uVar13; uVar13 = uVar13 + 1) {
                  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416(*(uint *)(lVar23 + uVar13 * 4)),
                                            ZEXT416(*(uint *)((long)pvVar17 + uVar13 * 4)));
                }
                *(int *)((long)pvVar10 +
                        uVar16 * 4 + sVar9 * uVar24 + sVar8 * uVar22 + sVar7 * lVar15) =
                     auVar25._0_4_;
                pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar20 * 4);
                lVar23 = lVar23 + (long)(int)lVar5 * 4;
              }
              lVar21 = lVar21 + 4;
            }
          }
          return;
        }
        pcVar14 = "src0->nb[1] == src0->ne[0]*sizeof(float)";
        uVar18 = 0x1d1e;
      }
      else {
        pcVar14 = "src1->nb[0] == sizeof(float)";
        uVar18 = 0x1d1d;
      }
    }
    else {
      pcVar14 = "src0->nb[0] == sizeof(float)";
      uVar18 = 0x1d1c;
    }
  }
  else {
    pcVar14 = "dst->ne[0] == nr";
    uVar18 = 0x1d1b;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,uVar18,"GGML_ASSERT(%s) failed",pcVar14);
}

Assistant:

void ggml_compute_forward_ssm_conv(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_conv_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}